

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsDictionaryMatcher::matches
          (UCharsDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,
          int32_t *lengths,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  int32_t iVar1;
  UStringTrieResult UVar2;
  int64_t iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  UCharsTrie uct;
  int local_7c;
  UCharsTrie local_70;
  int32_t *local_50;
  int32_t *local_48;
  int64_t local_40;
  UChar *local_38;
  
  local_70.uchars_ = this->characters;
  local_70.ownedArray_ = (char16_t *)0x0;
  local_70.remainingMatchLength_ = -1;
  local_70.pos_ = local_70.uchars_;
  local_38 = local_70.uchars_;
  local_40 = utext_getNativeIndex_63(text);
  local_50 = lengths;
  local_48 = cpLengths;
  iVar1 = utext_next32_63(text);
  local_7c = 0;
  iVar4 = 0;
  do {
    if (iVar1 < 0) {
LAB_003664e5:
      if (prefix != (int32_t *)0x0) {
        *prefix = iVar4;
      }
      UCharsTrie::~UCharsTrie(&local_70);
      return local_7c;
    }
    if (iVar4 == 0) {
      UVar2 = UCharsTrie::first(&local_70,iVar1);
    }
    else {
      UVar2 = UCharsTrie::next(&local_70,iVar1);
    }
    iVar3 = utext_getNativeIndex_63(text);
    iVar5 = (int)iVar3 - (int)local_40;
    if ((int)UVar2 < 2) {
      if (UVar2 != USTRINGTRIE_NO_MATCH) goto LAB_003664cb;
LAB_003664e2:
      iVar4 = iVar4 + 1;
      goto LAB_003664e5;
    }
    if (local_7c < limit) {
      lVar6 = (long)local_7c;
      if (values != (int32_t *)0x0) {
        iVar1 = UCharsTrie::getValue(&local_70);
        values[lVar6] = iVar1;
      }
      if (local_50 != (int32_t *)0x0) {
        local_50[lVar6] = iVar5;
      }
      if (local_48 != (int32_t *)0x0) {
        local_48[lVar6] = iVar4 + 1;
      }
      local_7c = local_7c + 1;
    }
    if (UVar2 == USTRINGTRIE_FINAL_VALUE) goto LAB_003664e2;
LAB_003664cb:
    if (maxLength <= iVar5) goto LAB_003664e2;
    iVar1 = utext_next32_63(text);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int32_t UCharsDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {

    UCharsTrie uct(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? uct.first(c) : uct.next(c);
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = uct.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}